

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.c++
# Opt level: O1

Maybe<capnp::EnumSchema::Enumerant> * __thiscall
capnp::EnumSchema::findEnumerantByName
          (Maybe<capnp::EnumSchema::Enumerant> *__return_storage_ptr__,EnumSchema *this,
          StringPtr name)

{
  ushort uVar1;
  RawSchema *pRVar2;
  bool bVar3;
  NullableValue<capnp::EnumSchema::Enumerant> *pNVar4;
  EnumSchema EVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  ulong uVar9;
  ulong __n;
  ulong __n_00;
  uint32_t uVar10;
  uint uVar11;
  bool bVar12;
  Reader RVar13;
  undefined6 uStack_be;
  StructReader local_b8;
  PointerReader local_88;
  EnumerantList local_68;
  
  uVar9 = name.content.size_;
  pRVar2 = ((this->super_Schema).raw)->generic;
  getEnumerants(&local_68,this);
  uVar10 = pRVar2->memberCount;
  uVar7 = 0;
  do {
    EVar5.super_Schema.raw = local_68.parent.super_Schema.raw;
    if (uVar10 <= uVar7) {
      (__return_storage_ptr__->ptr).isSet = false;
      return __return_storage_ptr__;
    }
    uVar1 = *(ushort *)((long)pRVar2->membersByName + (ulong)(uVar10 + uVar7 & 0xfffffffe));
    capnp::_::ListReader::getStructElement(&local_b8,&local_68.list.reader,(uint)uVar1);
    local_88.pointer = local_b8.pointers;
    local_88.capTable = local_b8.capTable;
    local_88.segment = local_b8.segment;
    local_88.nestingLimit = local_b8.nestingLimit;
    if (local_b8.pointerCount == 0) {
      local_88.pointer = (WirePointer *)0x0;
      local_88.capTable = (CapTableReader *)0x0;
      local_88.segment = (SegmentReader *)0x0;
      local_88.nestingLimit = 0x7fffffff;
    }
    bVar12 = false;
    RVar13 = capnp::_::PointerReader::getBlob<capnp::Text>(&local_88,(void *)0x0,0);
    __n = RVar13.super_StringPtr.content.size_;
    if (__n == uVar9) {
      if (__n == 0) {
        bVar12 = true;
      }
      else {
        iVar8 = bcmp(RVar13.super_StringPtr.content.ptr,name.content.ptr,__n);
        bVar12 = iVar8 == 0;
      }
    }
    if (bVar12) {
      (__return_storage_ptr__->ptr).isSet = true;
      pNVar4 = &__return_storage_ptr__->ptr;
      *(StructDataBitCount *)((long)&pNVar4->field_1 + 0x30) = local_b8.dataSize;
      *(StructPointerCount *)((long)&pNVar4->field_1 + 0x34) = local_b8.pointerCount;
      *(undefined2 *)((long)&pNVar4->field_1 + 0x36) = local_b8._38_2_;
      *(ulong *)&(__return_storage_ptr__->ptr).field_1.value.proto._reader.nestingLimit =
           CONCAT44(local_b8._44_4_,local_b8.nestingLimit);
      (__return_storage_ptr__->ptr).field_1.value.proto._reader.data = local_b8.data;
      (__return_storage_ptr__->ptr).field_1.value.proto._reader.pointers = local_b8.pointers;
      (__return_storage_ptr__->ptr).field_1.value.proto._reader.segment = local_b8.segment;
      (__return_storage_ptr__->ptr).field_1.value.proto._reader.capTable = local_b8.capTable;
      (__return_storage_ptr__->ptr).field_1.value.parent.super_Schema.raw =
           (RawBrandedSchema *)EVar5.super_Schema.raw;
      *(ulong *)((long)&(__return_storage_ptr__->ptr).field_1 + 8) = CONCAT62(uStack_be,uVar1);
      uVar6 = uVar10;
    }
    else {
      uVar11 = uVar10 + uVar7 >> 1;
      __n_00 = __n;
      if (__n >= uVar9) {
        __n_00 = uVar9;
      }
      iVar8 = memcmp(RVar13.super_StringPtr.content.ptr,name.content.ptr,__n_00);
      bVar3 = iVar8 < 0;
      if (iVar8 == 0) {
        bVar3 = __n < uVar9;
      }
      uVar6 = uVar11;
      if (bVar3) {
        uVar6 = uVar10;
        uVar7 = uVar11 + 1;
      }
    }
    uVar10 = uVar6;
  } while (!bVar12);
  return __return_storage_ptr__;
}

Assistant:

kj::Maybe<EnumSchema::Enumerant> EnumSchema::findEnumerantByName(kj::StringPtr name) const {
  return findSchemaMemberByName(raw->generic, name, getEnumerants());
}